

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Node * __thiscall wasm::DataFlow::Graph::doVisitGeneric(Graph *this,Expression *curr)

{
  ulong uVar1;
  Expression ***pppEVar2;
  Node *pNVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  AbstractChildIterator<wasm::ChildIterator> local_70;
  
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_70,curr);
  uVar1 = ((ulong)((long)local_70.children.flexible.
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_70.children.flexible.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3) +
          local_70.children.usedFixed;
  if ((int)uVar1 != 0) {
    uVar6 = 0;
    do {
      uVar5 = ((long)local_70.children.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_70.children.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) + local_70.children.usedFixed;
      if (uVar5 <= uVar6) {
        __assert_fail("index < children.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/iteration.h"
                      ,0x4a,
                      "Index wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex(Index) const [Specific = wasm::ChildIterator]"
                     );
      }
      uVar4 = (int)uVar5 + ~(uint)uVar6;
      pppEVar2 = local_70.children.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((ulong)uVar4 - 4);
      if ((uVar4 & 0xfffffffc) == 0) {
        pppEVar2 = local_70.children.fixed._M_elems + uVar4;
      }
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,**pppEVar2);
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uVar1 & 0xffffffff));
  }
  if (local_70.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pNVar3 = makeVar(this,(Type)(curr->type).id);
  return pNVar3;
}

Assistant:

Node* doVisitGeneric(Expression* curr) {
    // Just need to visit the nodes so we note all the gets
    for (auto* child : ChildIterator(curr)) {
      visit(child);
    }
    return makeVar(curr->type);
  }